

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum_Base.h
# Opt level: O0

uint32_t Hacl_Bignum_Lib_bn_get_top_index_u32(uint32_t len,uint32_t *b)

{
  uint32_t uVar1;
  uint local_20;
  uint32_t mask;
  uint32_t i;
  uint32_t priv;
  uint32_t *b_local;
  uint32_t len_local;
  
  mask = 0;
  for (local_20 = 0; local_20 < len; local_20 = local_20 + 1) {
    uVar1 = FStar_UInt32_eq_mask(b[local_20],0);
    mask = uVar1 & mask | (uVar1 ^ 0xffffffff) & local_20;
  }
  return mask;
}

Assistant:

static inline uint32_t Hacl_Bignum_Lib_bn_get_top_index_u32(uint32_t len, uint32_t *b)
{
  uint32_t priv = 0U;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint32_t mask = FStar_UInt32_eq_mask(b[i], 0U);
    priv = (mask & priv) | (~mask & i);
  }
  return priv;
}